

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

void __thiscall markdown::token::Container::writeAsHtml(Container *this,ostream *out)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (*(this->super_Token)._vptr_Token[0x10])();
  p_Var2 = (this->mSubTokens).
           super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var2 == (_List_node_base *)&this->mSubTokens) {
      (*(this->super_Token)._vptr_Token[0x11])(this,out);
      return;
    }
    p_Var1 = p_Var2[1]._M_next;
    if (p_Var1 == (_List_node_base *)0x0) break;
    (**(code **)((long)p_Var1->_M_next + 0x10))(p_Var1,out);
    p_Var2 = p_Var2->_M_next;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<markdown::Token>::operator->() const [T = markdown::Token]"
               );
}

Assistant:

void Container::writeAsHtml(std::ostream& out) const {
	preWrite(out);
	for (CTokenGroupIter i=mSubTokens.begin(), ie=mSubTokens.end(); i!=ie; ++i)
		(*i)->writeAsHtml(out);
	postWrite(out);
}